

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

Index __thiscall wabt::Module::GetFuncTypeIndex(Module *this,FuncSignature *sig)

{
  pointer ppTVar1;
  TypeEntry *pTVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  
  ppTVar1 = (this->types).super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->types).
                super__Vector_base<wabt::TypeEntry_*,_std::allocator<wabt::TypeEntry_*>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)ppTVar1;
  if (lVar4 != 0) {
    lVar4 = lVar4 >> 3;
    lVar5 = 0;
    do {
      pTVar2 = ppTVar1[lVar5];
      if (((pTVar2 != (TypeEntry *)0x0) && (pTVar2->kind_ == Func)) &&
         (bVar3 = FuncSignature::operator==((FuncSignature *)(pTVar2 + 1),sig), bVar3)) {
        return (Index)lVar5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  return 0xffffffff;
}

Assistant:

Index Module::GetFuncTypeIndex(const FuncSignature& sig) const {
  for (size_t i = 0; i < types.size(); ++i) {
    if (auto* func_type = dyn_cast<FuncType>(types[i])) {
      if (func_type->sig == sig) {
        return i;
      }
    }
  }
  return kInvalidIndex;
}